

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextRegionCommentDoc(Lexer *this)

{
  Lexer *in_RSI;
  Position local_40;
  Position local_28;
  Lexer *this_local;
  
  this_local = this;
  nextChar(in_RSI);
  std::__cxx11::string::clear();
  while( true ) {
    while( true ) {
      if (in_RSI->currentChar == -1) {
        local_28.line._6_2_ = 2;
        local_28.line._0_4_ = 10;
        getCurrentCursor(&local_40,in_RSI);
        std::
        make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                  ((Level *)&local_28.startIndex,(LexerErrorCode *)((long)&local_28.line + 6),
                   &local_28);
        generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                            *)in_RSI);
        std::
        unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                       *)&local_28.startIndex);
        return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               this;
      }
      if (in_RSI->currentChar == 0x2a) break;
      std::__cxx11::string::operator+=((string *)&in_RSI->lastComment,(char)in_RSI->currentChar);
      nextChar(in_RSI);
    }
    nextChar(in_RSI);
    if (in_RSI->currentChar == 0x2f) break;
    std::__cxx11::string::operator+=((string *)&in_RSI->lastComment,'*');
  }
  nextChar(in_RSI);
  nextToken(this);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextRegionCommentDoc() noexcept {
  nextChar();
  lastComment.clear();

  while (currentChar != EOF) {
    if (currentChar == '*') {
      nextChar(); // eat *
      if (currentChar == '/') {
        nextChar(); // eat /
        return nextToken();
      }

      lastComment += '*';
      continue;
    }

    lastComment += (char) currentChar;

    nextChar();
  }

  return generateError(std::make_unique<LexerError>(LVL_ERROR, LexerErrorCode::LEX_ERR_REGION_COMMENT_END,
    getCurrentCursor()));
}